

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void Curl_hash_destroy(Curl_hash *h)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  
  if (h->table != (Curl_llist *)0x0) {
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < h->slots; uVar2 = uVar2 + 1) {
      Curl_llist_destroy((Curl_llist *)((long)&h->table->_head + lVar1),h);
      lVar1 = lVar1 + 0x20;
    }
    (*Curl_cfree)(h->table);
    h->table = (Curl_llist *)0x0;
  }
  h->slots = 0;
  h->size = 0;
  return;
}

Assistant:

void
Curl_hash_destroy(struct Curl_hash *h)
{
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    size_t i;
    for(i = 0; i < h->slots; ++i) {
      Curl_llist_destroy(&h->table[i], (void *) h);
    }
    Curl_safefree(h->table);
  }
  h->size = 0;
  h->slots = 0;
}